

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
* read_neighbors_abi_cxx11_
            (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *__return_storage_ptr__,xml_node<char> *root_node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  _Alloc_hider _Var3;
  xml_node<char> *pxVar4;
  long lVar5;
  int *piVar6;
  undefined8 uVar7;
  uint right_orientation;
  uint left_orientation;
  string right;
  string left;
  string right_tile;
  string left_tile;
  uint local_118;
  uint local_114;
  vector<std::tuple<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>>>
  *local_110;
  string local_108;
  pointer local_e8;
  string local_e0;
  string local_c0;
  undefined1 *local_90;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110 = (vector<std::tuple<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>>>
               *)__return_storage_ptr__;
  pxVar4 = rapidxml::xml_node<char>::first_node(root_node,"neighbors",(char *)0x0,0,0,true);
  pxVar4 = rapidxml::xml_node<char>::first_node(pxVar4,"neighbor",(char *)0x0,0,0,true);
  paVar1 = &local_c0.field_2;
  while( true ) {
    if (pxVar4 == (xml_node<char> *)0x0) {
      return (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)local_110;
    }
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"left","");
    rapidxml::get_attribute(&local_e0,pxVar4,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    lVar5 = std::__cxx11::string::find((char *)&local_e0,0x129538,0);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_e0);
    local_114 = 0;
    if (lVar5 != -1) break;
LAB_0010ae76:
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"right","");
    rapidxml::get_attribute(&local_108,pxVar4,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    lVar5 = std::__cxx11::string::find((char *)&local_108,0x129538,0);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_108);
    local_118 = 0;
    if (lVar5 != -1) {
      std::__cxx11::string::substr((ulong)&local_c0,(ulong)&local_108);
      _Var3._M_p = local_c0._M_dataplus._M_p;
      piVar6 = __errno_location();
      iVar2 = *piVar6;
      *piVar6 = 0;
      lVar5 = strtol(_Var3._M_p,&local_e8,10);
      if (local_e8 == _Var3._M_p) {
        std::__throw_invalid_argument("stoi");
      }
      else if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar6 != 0x22)) {
        if (*piVar6 == 0) {
          *piVar6 = iVar2;
        }
        local_118 = (uint)lVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        goto LAB_0010af83;
      }
      std::__throw_out_of_range("stoi");
      goto LAB_0010b08d;
    }
LAB_0010af83:
    std::_Tuple_impl<0ul,std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>::
    _Tuple_impl<std::__cxx11::string&,unsigned_int&,std::__cxx11::string&,unsigned_int&,void>
              ((_Tuple_impl<0ul,std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>
                *)&local_c0,&local_50,&local_114,&local_70,&local_118);
    std::
    vector<std::tuple<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::tuple<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int>>
              (local_110,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)&local_c0);
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if ((undefined1 *)local_c0._M_string_length != (undefined1 *)((long)&local_c0.field_2 + 8)) {
      operator_delete((void *)local_c0._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    pxVar4 = rapidxml::xml_node<char>::next_sibling(pxVar4,"neighbor",(char *)0x0,0,0,true);
  }
  std::__cxx11::string::substr((ulong)&local_c0,(ulong)&local_e0);
  _Var3._M_p = local_c0._M_dataplus._M_p;
  piVar6 = __errno_location();
  iVar2 = *piVar6;
  *piVar6 = 0;
  lVar5 = strtol(_Var3._M_p,(char **)&local_108,10);
  if (local_108._M_dataplus._M_p != _Var3._M_p) {
    if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (*piVar6 == 0x22)) goto LAB_0010b099;
    if (*piVar6 == 0) {
      *piVar6 = iVar2;
    }
    local_114 = (uint)lVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    goto LAB_0010ae76;
  }
LAB_0010b08d:
  std::__throw_invalid_argument("stoi");
LAB_0010b099:
  uVar7 = std::__throw_out_of_range("stoi");
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_110);
  _Unwind_Resume(uVar7);
}

Assistant:

vector<tuple<string, unsigned, string, unsigned>>
read_neighbors(xml_node<> *root_node) {
  vector<tuple<string, unsigned, string, unsigned>> neighbors;
  xml_node<> *neighbor_node = root_node->first_node("neighbors");
  for (xml_node<> *node = neighbor_node->first_node("neighbor"); node;
       node = node->next_sibling("neighbor")) {
    string left = rapidxml::get_attribute(node, "left");
    string::size_type left_delimiter = left.find(" ");
    string left_tile = left.substr(0, left_delimiter);
    unsigned left_orientation = 0;
    if (left_delimiter != string::npos) {
      left_orientation = stoi(left.substr(left_delimiter, string::npos));
    }

    string right = rapidxml::get_attribute(node, "right");
    string::size_type right_delimiter = right.find(" ");
    string right_tile = right.substr(0, right_delimiter);
    unsigned right_orientation = 0;
    if (right_delimiter != string::npos) {
      right_orientation = stoi(right.substr(right_delimiter, string::npos));
    }
    neighbors.push_back(
        {left_tile, left_orientation, right_tile, right_orientation});
  }
  return neighbors;
}